

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O0

void __thiscall p2t::Triangle::ClearNeighbor(Triangle *this,Triangle *triangle)

{
  Triangle *triangle_local;
  Triangle *this_local;
  
  if (this->neighbors_[0] == triangle) {
    this->neighbors_[0] = (Triangle *)0x0;
  }
  else if (this->neighbors_[1] == triangle) {
    this->neighbors_[1] = (Triangle *)0x0;
  }
  else {
    this->neighbors_[2] = (Triangle *)0x0;
  }
  return;
}

Assistant:

void Triangle::ClearNeighbor(const Triangle *triangle )
{
    if( neighbors_[0] == triangle )
    {
        neighbors_[0] = NULL;
    }
    else if( neighbors_[1] == triangle )
    {
        neighbors_[1] = NULL;
    }
    else
    {
        neighbors_[2] = NULL;
    }
}